

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_DCtx_setParameter(ZSTD_DCtx *dctx,ZSTD_dParameter dParam,int value)

{
  int iVar1;
  size_t sStack_8;
  
  if (dctx->streamStage == zdss_init) {
    if (dParam == ZSTD_d_experimentalParam1) {
      if ((uint)value < 2) {
        dctx->format = value;
        return 0;
      }
    }
    else {
      if (dParam != ZSTD_d_windowLogMax) {
        return 0xffffffffffffffd8;
      }
      iVar1 = 0x1b;
      if (value != 0) {
        iVar1 = value;
      }
      if (0xffffffe9 < iVar1 - 0x20U) {
        dctx->maxWindowSize = 1L << ((byte)iVar1 & 0x3f);
        return 0;
      }
    }
    sStack_8 = 0xffffffffffffffd6;
  }
  else {
    sStack_8 = 0xffffffffffffffc4;
  }
  return sStack_8;
}

Assistant:

size_t ZSTD_DCtx_setParameter(ZSTD_DCtx* dctx, ZSTD_dParameter dParam, int value)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong);
    switch(dParam) {
        case ZSTD_d_windowLogMax:
            if (value == 0) value = ZSTD_WINDOWLOG_LIMIT_DEFAULT;
            CHECK_DBOUNDS(ZSTD_d_windowLogMax, value);
            dctx->maxWindowSize = ((size_t)1) << value;
            return 0;
        case ZSTD_d_format:
            CHECK_DBOUNDS(ZSTD_d_format, value);
            dctx->format = (ZSTD_format_e)value;
            return 0;
        default:;
    }
    RETURN_ERROR(parameter_unsupported);
}